

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O2

void __thiscall SQCompilation::CheckerVisitor::visitBlock(CheckerVisitor *this,Block *b)

{
  pointer *ppSVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  uint uVar4;
  VarScope *pVVar5;
  Statement **ppSVar6;
  long lVar7;
  VarScope local_88;
  StackSlot local_38;
  
  checkForgottenDo(this,b);
  checkUnreachableCode(this,b);
  checkAssignedTwice(this,b);
  checkFunctionSimilarity(this,b);
  checkAssignExpressionSimilarity(this,b);
  pVVar5 = this->currentScope;
  if (pVVar5 == (VarScope *)0x0) {
    local_88.owner = (FunctionDecl *)0x0;
    local_88.evalId = 0;
    local_88.depth = 0;
  }
  else {
    local_88.owner = pVVar5->owner;
    uVar2 = pVVar5->evalId;
    uVar3 = pVVar5->depth;
    local_88.evalId = uVar2 + 1;
    local_88.depth = uVar3 + 1;
  }
  local_88.symbols._M_h._M_buckets = &local_88.symbols._M_h._M_single_bucket;
  local_88.symbols._M_h._M_bucket_count = 1;
  local_88.symbols._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_88.symbols._M_h._M_element_count = 0;
  local_88.symbols._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_88.symbols._M_h._M_rehash_policy._M_next_resize = 0;
  local_88.symbols._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->currentScope = &local_88;
  local_38.sst = SST_NODE;
  local_88.parent = pVVar5;
  local_38.field_1 = (anon_union_8_2_108c9717_for_StackSlot_1)b;
  std::
  vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
  ::emplace_back<SQCompilation::CheckerVisitor::StackSlot>(&this->nodeStack,&local_38);
  ppSVar6 = (b->_statements)._vals;
  uVar4 = (b->_statements)._size;
  for (lVar7 = 0; (ulong)uVar4 << 3 != lVar7; lVar7 = lVar7 + 8) {
    Node::visit<SQCompilation::CheckerVisitor>(*(Node **)((long)ppSVar6 + lVar7),this);
    local_88.evalId = local_88.evalId + 1;
  }
  ppSVar1 = &(this->nodeStack).
             super__Vector_base<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  *ppSVar1 = *ppSVar1 + -1;
  local_88.parent = (VarScope *)0x0;
  VarScope::checkUnusedSymbols(&local_88,this);
  this->currentScope = pVVar5;
  VarScope::~VarScope(&local_88);
  return;
}

Assistant:

void CheckerVisitor::visitBlock(Block *b) {
  checkForgottenDo(b);
  checkUnreachableCode(b);
  checkAssignedTwice(b);
  checkFunctionSimilarity(b);
  checkAssignExpressionSimilarity(b);

  VarScope *thisScope = currentScope;
  VarScope blockScope(thisScope ? thisScope->owner : nullptr, thisScope);
  currentScope = &blockScope;

  nodeStack.push_back({ SST_NODE, b });

  for (Statement *s : b->statements()) {
    s->visit(this);
    blockScope.evalId += 1;
  }

  nodeStack.pop_back();

  blockScope.parent = nullptr;
  blockScope.checkUnusedSymbols(this);
  currentScope = thisScope;
}